

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int UnixVfs_getcwd(jx9_context *pCtx)

{
  int iVar1;
  char *zString;
  char zBuf [4096];
  char acStack_1008 [4096];
  
  zString = getcwd(acStack_1008,0x1000);
  if (zString == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    jx9_value_string(pCtx->pRet,zString,-1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int UnixVfs_getcwd(jx9_context *pCtx)
{
	char zBuf[4096];
	char *zDir;
	/* Get the current directory */
	zDir = getcwd(zBuf, sizeof(zBuf));
	if( zDir == 0 ){
	  return -1;
    }
	jx9_result_string(pCtx, zDir, -1/*Compute length automatically*/);
	return JX9_OK;
}